

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShapeTests.cpp
# Opt level: O3

int testRangeVal(void)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  RangeValue test1;
  RangeValue test2;
  RangeValue test3;
  RangeValue test4;
  RangeValue sub9;
  RangeValue div7;
  RangeValue div5;
  RangeValue div6;
  RangeValue div4;
  RangeValue div3;
  RangeValue div2;
  RangeValue div1;
  RangeValue sub12;
  RangeValue sub11;
  RangeValue sub10;
  RangeValue sub6;
  RangeValue sub5;
  RangeValue sub4;
  RangeValue sub3;
  RangeValue sub2;
  RangeValue sub1;
  RangeValue mul4;
  RangeValue mul3;
  RangeValue mul2;
  RangeValue mul1;
  RangeValue add4;
  RangeValue add3;
  RangeValue add2;
  RangeValue add1;
  RangeValue RStack_1e8;
  RangeValue local_1d8;
  RangeValue local_1c8;
  RangeValue local_1b8 [26];
  
  CoreML::RangeValue::RangeValue(&RStack_1e8);
  bVar1 = CoreML::RangeValue::isUnbound(&RStack_1e8);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    pcVar5 = "test1.isUnbound()";
    lVar4 = 0x11;
    goto LAB_0015b50a;
  }
  CoreML::RangeValue::RangeValue(&local_1d8,2);
  bVar1 = CoreML::RangeValue::operator>(&RStack_1e8,&local_1d8);
  if (bVar1) {
    bVar1 = CoreML::RangeValue::operator>=(&RStack_1e8,&local_1d8);
    if (bVar1) {
      bVar1 = CoreML::RangeValue::operator<(&local_1d8,&RStack_1e8);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        pcVar5 = "test2 < test1";
        goto LAB_0015b4a4;
      }
      bVar1 = CoreML::RangeValue::operator<=(&local_1d8,&RStack_1e8);
      if (bVar1) {
        bVar1 = CoreML::RangeValue::operator>(&RStack_1e8,2);
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          pcVar5 = "test1 > 2";
          goto LAB_0015b679;
        }
        bVar1 = CoreML::RangeValue::operator>=(&RStack_1e8,2);
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          pcVar5 = "test1 >= 2";
          goto LAB_0015b6dd;
        }
        bVar1 = CoreML::RangeValue::operator<(&RStack_1e8,6);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          pcVar5 = "!(test1 < 6)";
          lVar4 = 0xc;
          goto LAB_0015b93e;
        }
        bVar1 = CoreML::RangeValue::operator<=(&RStack_1e8,6);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          pcVar5 = "!(test1 <= 6)";
        }
        else {
          CoreML::RangeValue::RangeValue(&local_1c8,3);
          bVar1 = CoreML::RangeValue::operator>(&local_1c8,&local_1d8);
          if (bVar1) {
            bVar1 = CoreML::RangeValue::operator>=(&local_1c8,&local_1d8);
            if (bVar1) {
              bVar1 = CoreML::RangeValue::operator<(&local_1d8,&local_1c8);
              if (!bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x28);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                pcVar5 = "test2 < test3";
                goto LAB_0015b939;
              }
              bVar1 = CoreML::RangeValue::operator<=(&local_1d8,&local_1c8);
              if (bVar1) {
                bVar1 = CoreML::RangeValue::operator<(&local_1d8,3);
                if (bVar1) {
                  bVar1 = CoreML::RangeValue::operator<=(&local_1d8,3);
                  if (bVar1) {
                    bVar1 = CoreML::RangeValue::operator>(&local_1d8,1);
                    if (!bVar1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                 ,0x6c);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,":",1);
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                      pcVar5 = "test2 > 1";
                      goto LAB_0015b679;
                    }
                    bVar1 = CoreML::RangeValue::operator>=(&local_1d8,1);
                    if (bVar1) {
                      bVar1 = CoreML::RangeValue::operator>=(&local_1d8,2);
                      if (bVar1) {
                        CoreML::RangeValue::RangeValue(local_1b8);
                        bVar1 = CoreML::RangeValue::operator>(local_1b8,&RStack_1e8);
                        if (bVar1) {
                          bVar1 = CoreML::RangeValue::operator>(&RStack_1e8,local_1b8);
                          if (bVar1) {
                            bVar1 = CoreML::RangeValue::operator<(local_1b8,&RStack_1e8);
                            if (bVar1) {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                         ,0x6c);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,":",1);
                              poVar2 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cout,0x36);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar2,": error: ",9);
                              pcVar5 = "!(test4 < test1)";
                            }
                            else {
                              bVar1 = CoreML::RangeValue::operator<(&RStack_1e8,local_1b8);
                              if (!bVar1) {
                                bVar1 = CoreML::RangeValue::operator>=(local_1b8,&RStack_1e8);
                                if (bVar1) {
                                  bVar1 = CoreML::RangeValue::operator>=(&RStack_1e8,local_1b8);
                                  if (bVar1) {
                                    bVar1 = CoreML::RangeValue::operator<=(local_1b8,&RStack_1e8);
                                    if (bVar1) {
                                      bVar1 = CoreML::RangeValue::operator<=(&RStack_1e8,local_1b8);
                                      if (bVar1) {
                                        sVar3 = CoreML::RangeValue::value(&local_1d8);
                                        if (sVar3 == 2) {
                                          CoreML::RangeValue::value(&RStack_1e8);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  ,0x6c);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,":",1);
                                          poVar2 = (ostream *)
                                                   std::ostream::operator<<
                                                             ((ostream *)&std::cout,0x43);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar2,": error: ",9);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar2,"0",1);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar2," was false, expected true.",0x1a);
                                          std::endl<char,std::char_traits<char>>(poVar2);
                                          return 1;
                                        }
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                  ,0x6c);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        poVar2 = (ostream *)
                                                 std::ostream::operator<<
                                                           ((ostream *)&std::cout,0x3f);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar2,": error: ",9);
                                        pcVar5 = "test2.value() == 2";
                                        lVar4 = 0x12;
                                        goto LAB_0015b93e;
                                      }
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                 ,0x6c);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,":",1);
                                      poVar2 = (ostream *)
                                               std::ostream::operator<<((ostream *)&std::cout,0x3c);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar2,": error: ",9);
                                      pcVar5 = "test1 <= test4";
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                                 ,0x6c);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,":",1);
                                      poVar2 = (ostream *)
                                               std::ostream::operator<<((ostream *)&std::cout,0x3b);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar2,": error: ",9);
                                      pcVar5 = "test4 <= test1";
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                               ,0x6c);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,":",1);
                                    poVar2 = (ostream *)
                                             std::ostream::operator<<((ostream *)&std::cout,0x3a);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar2,": error: ",9);
                                    pcVar5 = "test1 >= test4";
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                             ,0x6c);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,":",1);
                                  poVar2 = (ostream *)
                                           std::ostream::operator<<((ostream *)&std::cout,0x39);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar2,": error: ",9);
                                  pcVar5 = "test4 >= test1";
                                }
                                goto LAB_0015b9c1;
                              }
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                         ,0x6c);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,":",1);
                              poVar2 = (ostream *)
                                       std::ostream::operator<<((ostream *)&std::cout,0x37);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar2,": error: ",9);
                              pcVar5 = "!(test1 < test4)";
                            }
                            lVar4 = 0x10;
                            goto LAB_0015b93e;
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                     ,0x6c);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                          pcVar5 = "test1 > test4";
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                     ,0x6c);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x34);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                          pcVar5 = "test4 > test1";
                        }
                        goto LAB_0015b939;
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                 ,0x6c);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,":",1);
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                      pcVar5 = "test2 >= 2";
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                                 ,0x6c);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,":",1);
                      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2e);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                      pcVar5 = "test2 >= 1";
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                               ,0x6c);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                    pcVar5 = "test2 <= 3";
                  }
LAB_0015b6dd:
                  lVar4 = 10;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                             ,0x6c);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2b);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
                  pcVar5 = "test2 < 3";
LAB_0015b679:
                  lVar4 = 9;
                }
                goto LAB_0015b93e;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x29);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
              pcVar5 = "test2 <= test3";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x27);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
              pcVar5 = "test3 >= test2";
            }
LAB_0015b9c1:
            lVar4 = 0xe;
            goto LAB_0015b93e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x26);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
          pcVar5 = "test3 > test2";
        }
LAB_0015b939:
        lVar4 = 0xd;
LAB_0015b93e:
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
        std::endl<char,std::char_traits<char>>(poVar2);
        return 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      pcVar5 = "test2 <= test1";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      pcVar5 = "test1 >= test2";
    }
    lVar4 = 0xe;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    pcVar5 = "test1 > test2";
LAB_0015b4a4:
    lVar4 = 0xd;
  }
LAB_0015b50a:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 1;
}

Assistant:

int testRangeVal() {

    // Unbound constructor
    RangeValue test1 = RangeValue();
    ML_ASSERT(test1.isUnbound());

    // Relations between set and unbound
    RangeValue test2 = RangeValue(2);
    ML_ASSERT(test1 > test2);
    ML_ASSERT(test1 >= test2);
    ML_ASSERT(test2 < test1);
    ML_ASSERT(test2 <= test1);

    ML_ASSERT(test1 > 2);
    ML_ASSERT(test1 >= 2);

    ML_ASSERT(!(test1 < 6));
    ML_ASSERT(!(test1 <= 6));

    // Relations between two set values
    RangeValue test3 = RangeValue(3);
    ML_ASSERT(test3 > test2);
    ML_ASSERT(test3 >= test2);
    ML_ASSERT(test2 < test3);
    ML_ASSERT(test2 <= test3);

    ML_ASSERT(test2 < 3);
    ML_ASSERT(test2 <= 3);
    ML_ASSERT(test2 > 1);
    ML_ASSERT(test2 >= 1);
    ML_ASSERT(test2 >= 2);


    // Test two unbound values
    RangeValue test4 = RangeValue();
    ML_ASSERT(test4 > test1);
    ML_ASSERT(test1 > test4);
    ML_ASSERT(!(test4 < test1));
    ML_ASSERT(!(test1 < test4));

    ML_ASSERT(test4 >= test1);
    ML_ASSERT(test1 >= test4);
    ML_ASSERT(test4 <= test1);
    ML_ASSERT(test1 <= test4);


    ML_ASSERT(test2.value() == 2);
    bool catch_me = false;
    try {
        test1.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        // this should throw, so we're ok -- this is a pass
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    // Test arithmetic
    RangeValue add1 = test1 + test2;
    ML_ASSERT(add1.isUnbound());
    RangeValue add2 = test2 + test3;
    ML_ASSERT(add2.value() == 5);
    RangeValue add3 = test1 + 4;
    ML_ASSERT(add3.isUnbound());
    RangeValue add4 = test2 + 4;
    ML_ASSERT(add4.value() == 6);

    RangeValue mul1 = test1 * test2;
    ML_ASSERT(mul1.isUnbound());
    RangeValue mul2 = test2 * test3;
    ML_ASSERT(mul2.value() == 6);
    RangeValue mul3 = test1 * 4;
    ML_ASSERT(mul3.isUnbound());
    RangeValue mul4 = test2 * 4;
    ML_ASSERT(mul4.value() == 8);

    RangeValue sub1 = test1 - test2;
    ML_ASSERT(sub1.isUnbound());
    RangeValue sub2 = test2 - test3;
    ML_ASSERT(sub2.value() == 0);
    RangeValue sub3 = test1 - 4;
    ML_ASSERT(sub3.isUnbound());
    RangeValue sub4 = test2 - 4;
    ML_ASSERT(sub4.value() == 0);
    RangeValue sub5 = test3 - test2;
    ML_ASSERT(sub5.value() == 1);
    RangeValue sub6 = test3 - 1;
    ML_ASSERT(sub6.value() == 2);

    catch_me = false;
    try {
        RangeValue sub7 = test2 - test1;
        sub7.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    catch_me = false;
    try {
        RangeValue sub8 = test4 - test1;
        sub8.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    RangeValue sub9 = test1 - -5;
    ML_ASSERT(sub9.isUnbound());
    RangeValue sub10 = test2 - -1;
    ML_ASSERT(sub10.value() == 3);
    RangeValue sub11 = test1 - 50;
    ML_ASSERT(sub11.isUnbound());
    RangeValue sub12 = test2 - 50;
    ML_ASSERT(sub12.value() == 0);

    RangeValue div1 = test1 / test2;
    ML_ASSERT(div1.isUnbound());
    RangeValue div2 = test2 / test3;
    ML_ASSERT(div2.value() == 0);
    RangeValue div3 = test1 / 4;
    ML_ASSERT(div3.isUnbound());
    RangeValue div4 = RangeValue(10) / 2;
    ML_ASSERT(div4.value() == 5);
    RangeValue div5 = test3 / test2;
    ML_ASSERT(div5.value() == 1);
    RangeValue div6 = test3 / 1;
    ML_ASSERT(div6.value() == 3);

    catch_me = false;
    try {
        RangeValue div7 = test2 / test1;
        div7.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    catch_me = false;
    try {
        RangeValue div8 = test4 / test1;
        div8.value();
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    test1.set(10);
    ML_ASSERT(!test1.isUnbound());
    ML_ASSERT(test1.value() == 10);
    test2.set(test3);
    ML_ASSERT(!test2.isUnbound());
    ML_ASSERT(test2.value() == 3);

    return 0;
}